

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_print.c
# Opt level: O0

int BIO_vsnprintf(char *buf,size_t n,char *format,va_list args)

{
  int iVar1;
  int truncated;
  size_t retlen;
  char *in_stack_000002c0;
  int *in_stack_000002c8;
  size_t *in_stack_000002d0;
  size_t *in_stack_000002d8;
  char **in_stack_000002e0;
  char **in_stack_000002e8;
  __va_list_tag *in_stack_00000300;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_4;
  
  iVar1 = _dopr(in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,
                in_stack_000002c8,in_stack_000002c0,in_stack_00000300);
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else if (local_34 == 0) {
    if (local_30 < 0x80000000) {
      local_38 = (int)local_30;
    }
    else {
      local_38 = -1;
    }
    local_4 = local_38;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int BIO_vsnprintf(char *buf, size_t n, const char *format, va_list args)
{
    size_t retlen;
    int truncated;

    if (!_dopr(&buf, NULL, &n, &retlen, &truncated, format, args))
        return -1;

    if (truncated)
        /*
         * In case of truncation, return -1 like traditional snprintf.
         * (Current drafts for ISO/IEC 9899 say snprintf should return the
         * number of characters that would have been written, had the buffer
         * been large enough.)
         */
        return -1;
    return (retlen <= INT_MAX) ? (int)retlen : -1;
}